

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O3

void __thiscall mp::NLFeeder_Easy::FillNonlinearVars(NLFeeder_Easy *this)

{
  int *piVar1;
  ulong *puVar2;
  int iVar3;
  int *piVar4;
  _Bit_type *p_Var5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  
  std::vector<bool,_std::allocator<bool>_>::resize
            (&this->nlv_obj_,(long)(this->nlme_).vars_.num_col_,false);
  sVar6 = (this->nlme_).Q_.num_nz_;
  if (sVar6 != 0) {
    piVar4 = (this->nlme_).Q_.index_;
    piVar1 = &(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_objs;
    *piVar1 = *piVar1 + 1;
    p_Var5 = (this->nlv_obj_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    iVar7 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_vars_in_objs;
    do {
      iVar7 = iVar7 + 1;
      iVar3 = piVar4[sVar6 - 1];
      sVar6 = sVar6 - 1;
      iVar8 = iVar3 + 0x3f;
      if (-1 < (long)iVar3) {
        iVar8 = iVar3;
      }
      puVar2 = p_Var5 + (long)(iVar8 >> 6) +
                        (ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar2 = *puVar2 | 1L << ((byte)iVar3 & 0x3f);
      (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_vars_in_objs = iVar7;
    } while (sVar6 != 0);
  }
  return;
}

Assistant:

void FillNonlinearVars() {
    nlv_obj_.resize(NLME().NumCols());
    auto Q=NLME().Hessian();
    if (Q.num_nz_) {
      ++header_.num_nl_objs;                // STATS
      for (auto i=Q.num_nz_; i--; ) {
        assert(i<nlv_obj_.size());
        nlv_obj_[Q.index_[i]] = true;
        ++header_.num_nl_vars_in_objs;      // STATS
      }
    }
  }